

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O2

void __thiscall sentencepiece::unigram::Model::PopulateNodes(Model *this,Lattice *lattice)

{
  float fVar1;
  int iVar2;
  char *pcVar3;
  key_type *key;
  key_type *pkVar4;
  void *pvVar5;
  bool bVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  ostream *poVar10;
  Node *pNVar11;
  undefined8 *puVar12;
  Lattice *this_00;
  size_t k;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  int length;
  Die local_81;
  Lattice *local_80;
  float local_74;
  ulong local_70;
  long local_68;
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  trie_results;
  
  local_74 = this->min_score_ + -10.0;
  uVar14 = (int)((ulong)((long)(lattice->surface_).
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(lattice->surface_).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  sVar7 = (lattice->sentence_)._M_len;
  pcVar3 = (lattice->sentence_)._M_str;
  local_80 = lattice;
  std::
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  ::vector(&trie_results,(long)this->trie_results_size_ + 1,(allocator_type *)&local_81);
  local_68 = 0;
  if ((int)uVar14 < 1) {
    uVar14 = 0;
  }
  for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
    key = (local_80->surface_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar15];
    sVar8 = Darts::DoubleArrayImpl<void,void,int,void>::
            commonPrefixSearch<Darts::DoubleArrayImpl<void,void,int,void>::result_pair_type>
                      ((DoubleArrayImpl<void,void,int,void> *)
                       (this->trie_)._M_t.
                       super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                       .
                       super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>
                       ._M_head_impl,key,
                       trie_results.
                       super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (long)trie_results.
                             super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)trie_results.
                             super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4,
                       (long)(((int)sVar7 + (int)pcVar3) - (int)key),0);
    if ((ulong)((long)trie_results.
                      super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)trie_results.
                      super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= sVar8) {
      local_81.die_ = true;
      pcVar9 = logging::BaseName("third_party/sentencepiece/src/unigram_model.cc");
      poVar10 = std::operator<<((ostream *)&std::cerr,pcVar9);
      poVar10 = std::operator<<(poVar10,"(");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x23a);
      poVar10 = std::operator<<(poVar10,") [");
      poVar10 = std::operator<<(poVar10,"(num_nodes) < (trie_results.size())");
      std::operator<<(poVar10,"] ");
      error::Die::~Die(&local_81);
    }
    bVar6 = false;
    this_00 = local_80;
    local_70 = uVar15;
    for (sVar13 = 0; uVar15 = local_70, sVar13 != sVar8; sVar13 = sVar13 + 1) {
      length = -1;
      puVar12 = (undefined8 *)
                ((long)(this_00->surface_).
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start + local_68);
      do {
        length = length + 1;
        pkVar4 = (key_type *)*puVar12;
        puVar12 = puVar12 + 1;
      } while (pkVar4 < key + trie_results.
                              super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar13].length);
      iVar2 = trie_results.
              super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
              ._M_impl.super__Vector_impl_data._M_start[sVar13].value;
      if (*(int *)((long)((((this->super_ModelInterface).model_proto_)->pieces_).
                          super_RepeatedPtrFieldBase.rep_)->elements[iVar2] + 0x3c) != 5) {
        pNVar11 = Lattice::Insert(this_00,(int)local_70,length);
        pNVar11->id = iVar2;
        pvVar5 = ((((this->super_ModelInterface).model_proto_)->pieces_).super_RepeatedPtrFieldBase.
                 rep_)->elements[iVar2];
        if (*(int *)((long)pvVar5 + 0x3c) == 4) {
          fVar1 = (float)length * this->max_score_ + -0.1;
        }
        else {
          fVar1 = *(float *)((long)pvVar5 + 0x38);
        }
        pNVar11->score = fVar1;
        this_00 = local_80;
        if (!bVar6) {
          if (pNVar11->length == 1) {
            bVar6 = true;
          }
        }
      }
    }
    if (!bVar6) {
      pNVar11 = Lattice::Insert(this_00,(int)local_70,1);
      pNVar11->id = (this->super_ModelInterface).unk_id_;
      pNVar11->score = local_74;
    }
    local_68 = local_68 + 8;
  }
  std::
  _Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  ::~_Vector_base(&trie_results.
                   super__Vector_base<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                 );
  return;
}

Assistant:

void Model::PopulateNodes(Lattice *lattice) const {
  auto get_chars_length = [&lattice](int begin_pos, const char *end) {
    int pos = begin_pos;
    while (lattice->surface(pos) < end) ++pos;
    return pos - begin_pos;
  };

  const float unk_score = min_score() - kUnkPenalty;

  const int len = lattice->size();
  const char *end = lattice->sentence() + lattice->utf8_size();

  // +1 just in case.
  std::vector<Darts::DoubleArray::result_pair_type> trie_results(
      trie_results_size_ + 1);

  for (int begin_pos = 0; begin_pos < len; ++begin_pos) {
    const char *begin = lattice->surface(begin_pos);

    // Finds all pieces which are prefix of surface(begin_pos).
    const size_t num_nodes = trie_->commonPrefixSearch(
        begin, trie_results.data(), trie_results.size(),
        static_cast<int>(end - begin));
    CHECK_LT(num_nodes, trie_results.size());

    bool has_single_node = false;

    // Inserts pieces to the lattice.
    for (size_t k = 0; k < num_nodes; ++k) {
      const int length =
          get_chars_length(begin_pos, begin + trie_results[k].length);
      const int id = trie_results[k].value;
      if (IsUnusedInlined(id)) continue;
      Lattice::Node *node = lattice->Insert(begin_pos, length);
      node->id = id;  // the value of Trie stores vocab_id.
      // User defined symbol receives extra bonus to always be selected.
      node->score = IsUserDefinedInlined(id) ? (length * max_score_ - 0.1)
                                             : GetScoreInlined(id);
      if (!has_single_node && node->length == 1) {
        has_single_node = true;
      }
    }

    if (!has_single_node) {
      Lattice::Node *node = lattice->Insert(begin_pos, 1);
      node->id = unk_id_;  // add UNK node.
      node->score = unk_score;
    }
  }
}